

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

bool __thiscall
ON_OBSOLETE_V5_Annotation::IsValid(ON_OBSOLETE_V5_Annotation *this,ON_TextLog *text_log)

{
  uint uVar1;
  bool bVar2;
  char *format;
  ulong uVar3;
  ulong uVar4;
  
  bVar2 = ON_Plane::IsValid(&this->m_plane);
  if (bVar2) {
    uVar1 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = 0;
    }
    uVar3 = 0;
    do {
      if (uVar4 * 0x10 + 0x10 == uVar3 + 0x10) {
        if ((byte)(this->m_type - dtDimLinear) < 8) {
          return true;
        }
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,
                          "ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",
                          (ulong)this->m_type);
        return false;
      }
      bVar2 = ON_2dPoint::IsValid((ON_2dPoint *)
                                  ((long)&((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a)->x
                                  + uVar3));
      uVar3 = uVar3 + 0x10;
    } while (bVar2);
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n";
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    format = "ON_OBSOLETE_V5_Annotation - m_plane is not valid\n";
  }
  ON_TextLog::Print(text_log,format);
  return false;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::IsValid( ON_TextLog* text_log ) const
{
  if ( !m_plane.IsValid() )
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_plane is not valid\n");
    }
    return false;
  }

  const int points_count = m_points.Count();

  int i;
  for ( i = 0; i < points_count; i++ )
  {
    if ( !m_points[i].IsValid() )
    {
      if ( text_log )
      {
        text_log->Print("ON_OBSOLETE_V5_Annotation - m_points[%d] is not valid.\n");
      }
      return false;
    }
  }

  switch ( m_type )
  {
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAngular:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtLeader:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtTextBlock:
  case ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate:
    break;

  default:
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_Annotation - m_type = %d is not a valid enum value\n",m_type);
    }
    return false;
    break;
  }

  return true;
}